

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O2

void __thiscall QRingChunk::allocate(QRingChunk *this,qsizetype alloc)

{
  Data *pDVar1;
  qsizetype qVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((this->chunk).d.size < alloc) || (pDVar1 = (this->chunk).d.d, pDVar1 == (Data *)0x0)) ||
     ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> != 1)) {
    QByteArray::QByteArray((QByteArray *)&local_38,alloc,Uninitialized);
    pDVar1 = (this->chunk).d.d;
    pcVar3 = (this->chunk).d.ptr;
    (this->chunk).d.d = local_38.d;
    (this->chunk).d.ptr = local_38.ptr;
    qVar2 = (this->chunk).d.size;
    (this->chunk).d.size = local_38.size;
    local_38.d = pDVar1;
    local_38.ptr = pcVar3;
    local_38.size = qVar2;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRingChunk::allocate(qsizetype alloc)
{
    Q_ASSERT(alloc > 0 && size() == 0);

    if (chunk.size() < alloc || isShared())
        chunk = QByteArray(alloc, Qt::Uninitialized);
}